

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

JumpStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::JumpStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3)

{
  Token semi;
  JumpStatementSyntax *this_00;
  long in_RCX;
  Token *in_R8;
  NamedLabelSyntax *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  this_00 = (JumpStatementSyntax *)
            allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (size_t)in_stack_ffffffffffffffa8);
  semi.info = (Info *)in_R8;
  semi._0_8_ = *(undefined8 *)(in_RCX + 8);
  slang::syntax::JumpStatementSyntax::JumpStatementSyntax
            (this_00,in_stack_ffffffffffffffa8,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*(SourceLocation *)&in_R8->info,
             *in_R8,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }